

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

void RunBenchmark<double>(TBenchmarkOpts *opts)

{
  value_type pdVar1;
  value_type pdVar2;
  bool bVar3;
  ostream *poVar4;
  void *pvVar5;
  reference ppdVar6;
  runtime_error *this;
  string *in_RDI;
  result_type_conflict rVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double *val;
  size_t j;
  char *outV;
  size_t cnt;
  char *inV;
  size_t i;
  vector<double_*,_std::allocator<double_*>_> outVectors;
  vector<double_*,_std::allocator<double_*>_> inVectors;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  outData;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  inData;
  uniform_real_distribution<double> dis;
  mt19937_64 rng;
  bool isTanh;
  bool isSigm;
  bool isLog;
  bool isExp;
  size_t alignment;
  size_t vecSize;
  size_t nIter;
  size_t nVectors;
  string func;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_stack_ffffffffffffece8;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_stack_ffffffffffffecf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffed00;
  size_type in_stack_ffffffffffffed08;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffed10;
  allocator<char> *in_stack_ffffffffffffed20;
  allocator<char> *paVar13;
  char *in_stack_ffffffffffffed28;
  char *pcVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffed30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  string *in_stack_ffffffffffffeda0;
  size_t in_stack_ffffffffffffeda8;
  string *in_stack_ffffffffffffedb0;
  vector<double_*,_std::allocator<double_*>_> *in_stack_ffffffffffffedb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *outVectors_00;
  vector<double_*,_std::allocator<double_*>_> *in_stack_ffffffffffffedc0;
  vector<double_*,_std::allocator<double_*>_> *inVectors_00;
  vector<double_*,_std::allocator<double_*>_> *in_stack_ffffffffffffedc8;
  vector<double_*,_std::allocator<double_*>_> *in_stack_ffffffffffffedd0;
  allocator<char> local_f91;
  string local_f90 [39];
  allocator<char> local_f69;
  string local_f68 [39];
  allocator<char> local_f41;
  string local_f40 [39];
  allocator<char> local_f19;
  string local_f18 [39];
  allocator<char> local_ef1;
  string local_ef0 [39];
  allocator<char> local_ec9;
  string local_ec8 [39];
  allocator<char> local_ea1;
  string local_ea0 [39];
  allocator<char> local_e79;
  string local_e78 [39];
  undefined1 local_e51 [40];
  allocator<char> local_e29;
  string local_e28 [39];
  allocator<char> local_e01;
  string local_e00 [39];
  allocator<char> local_dd9;
  string local_dd8 [39];
  allocator<char> local_db1;
  string local_db0 [39];
  allocator<char> local_d89;
  string local_d88 [39];
  allocator<char> local_d61;
  string local_d60 [39];
  allocator<char> local_d39;
  string local_d38 [39];
  allocator<char> local_d11;
  string local_d10 [39];
  allocator<char> local_ce9;
  string local_ce8 [39];
  allocator<char> local_cc1;
  string local_cc0 [39];
  allocator<char> local_c99;
  string local_c98 [39];
  allocator<char> local_c71;
  string local_c70 [39];
  allocator<char> local_c49;
  string local_c48 [39];
  allocator<char> local_c21;
  string local_c20 [39];
  allocator<char> local_bf9;
  string local_bf8 [39];
  allocator<char> local_bd1;
  string local_bd0 [39];
  allocator<char> local_ba9;
  string local_ba8 [39];
  allocator<char> local_b81;
  string local_b80 [39];
  allocator<char> local_b59;
  string local_b58 [39];
  allocator<char> local_b31;
  string local_b30 [39];
  allocator<char> local_b09;
  string local_b08 [32];
  double *local_ae8;
  char *local_ae0;
  value_type local_ad8;
  undefined8 local_ad0;
  value_type local_ac8;
  size_type local_ac0;
  vector<double_*,_std::allocator<double_*>_> local_ab0;
  vector<double_*,_std::allocator<double_*>_> local_a90;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  local_a70;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  local_a50 [106];
  byte local_5f;
  byte local_5e;
  byte local_5d;
  byte local_49;
  ulong local_48;
  char *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  ulong local_30;
  string local_28 [32];
  string *local_8;
  
  local_8 = in_RDI;
  std::__cxx11::string::string(local_28,in_RDI);
  local_30 = *(ulong *)(local_8 + 0x20);
  local_38 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(local_8 + 0x28)
  ;
  local_40 = *(char **)(local_8 + 0x30);
  local_48 = *(ulong *)(local_8 + 0x38);
  local_49 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffecf0,(char *)in_stack_ffffffffffffece8);
  local_5d = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffecf0,(char *)in_stack_ffffffffffffece8);
  local_5e = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffecf0,(char *)in_stack_ffffffffffffece8);
  local_5f = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffecf0,(char *)in_stack_ffffffffffffece8);
  if (((((local_49 & 1) == 0) && ((local_5d & 1) == 0)) && ((local_5e & 1) == 0)) &&
     (!(bool)local_5f)) {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "requirement isExp || isLog || isSigm || isTanh failed");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"Preparing data. Vector size: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(ulong)local_40);
  poVar4 = std::operator<<(poVar4,"\tnumber of vectors: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_30);
  poVar4 = std::operator<<(poVar4,"\tnumber of tries: ");
  pvVar5 = (void *)std::ostream::operator<<(poVar4,(ulong)local_38);
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::mersenne_twister_engine(in_stack_ffffffffffffecf0,(result_type)in_stack_ffffffffffffece8);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)in_stack_ffffffffffffecf0,
             (double)in_stack_ffffffffffffece8,5.86130826418596e-318);
  std::allocator<std::vector<char,_std::allocator<char>_>_>::allocator
            ((allocator<std::vector<char,_std::allocator<char>_>_> *)0x121a4d);
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::vector((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffed10,in_stack_ffffffffffffed08,
           (allocator_type *)in_stack_ffffffffffffed00);
  std::allocator<std::vector<char,_std::allocator<char>_>_>::~allocator
            ((allocator<std::vector<char,_std::allocator<char>_>_> *)0x121a79);
  std::allocator<std::vector<char,_std::allocator<char>_>_>::allocator
            ((allocator<std::vector<char,_std::allocator<char>_>_> *)0x121a9e);
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::vector((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffed10,in_stack_ffffffffffffed08,
           (allocator_type *)in_stack_ffffffffffffed00);
  std::allocator<std::vector<char,_std::allocator<char>_>_>::~allocator
            ((allocator<std::vector<char,_std::allocator<char>_>_> *)0x121aca);
  if (0x1f < local_48) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"requirement alignment < 32 failed");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  if ((local_48 & 7) == 0) {
    std::allocator<double_*>::allocator((allocator<double_*> *)0x121c0b);
    std::vector<double_*,_std::allocator<double_*>_>::vector
              ((vector<double_*,_std::allocator<double_*>_> *)in_stack_ffffffffffffed10,
               in_stack_ffffffffffffed08,(allocator_type *)in_stack_ffffffffffffed00);
    std::allocator<double_*>::~allocator((allocator<double_*> *)0x121c37);
    std::allocator<double_*>::allocator((allocator<double_*> *)0x121c5c);
    std::vector<double_*,_std::allocator<double_*>_>::vector
              ((vector<double_*,_std::allocator<double_*>_> *)in_stack_ffffffffffffed10,
               in_stack_ffffffffffffed08,(allocator_type *)in_stack_ffffffffffffed00);
    std::allocator<double_*>::~allocator((allocator<double_*> *)0x121c88);
    for (local_ac0 = 0; local_ac0 < local_30; local_ac0 = local_ac0 + 1) {
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::operator[](local_a50,local_ac0);
      std::vector<char,_std::allocator<char>_>::resize
                (in_stack_ffffffffffffed10,in_stack_ffffffffffffed08);
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::operator[](&local_a70,local_ac0);
      std::vector<char,_std::allocator<char>_>::resize
                (in_stack_ffffffffffffed10,in_stack_ffffffffffffed08);
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::operator[](local_a50,local_ac0);
      for (local_ac8 = (value_type)
                       std::vector<char,_std::allocator<char>_>::data
                                 ((vector<char,_std::allocator<char>_> *)0x121d25);
          ((ulong)local_ac8 & 0x1f) != local_48; local_ac8 = (value_type)((long)local_ac8 + 1)) {
      }
      local_ad0 = 0;
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::operator[](&local_a70,local_ac0);
      local_ad8 = (value_type)
                  std::vector<char,_std::allocator<char>_>::data
                            ((vector<char,_std::allocator<char>_> *)0x121df3);
      pdVar2 = local_ac8;
      for (; ((ulong)local_ad8 & 0x1f) != local_48; local_ad8 = (value_type)((long)local_ad8 + 1)) {
      }
      ppdVar6 = std::vector<double_*,_std::allocator<double_*>_>::operator[](&local_a90,local_ac0);
      pdVar1 = local_ad8;
      *ppdVar6 = pdVar2;
      ppdVar6 = std::vector<double_*,_std::allocator<double_*>_>::operator[](&local_ab0,local_ac0);
      *ppdVar6 = pdVar1;
      for (local_ae0 = (char *)0x0; local_ae0 < local_40; local_ae0 = local_ae0 + 1) {
        local_ae8 = local_ac8 + (long)local_ae0;
        rVar7 = std::uniform_real_distribution<double>::operator()
                          ((uniform_real_distribution<double> *)in_stack_ffffffffffffecf0,
                           in_stack_ffffffffffffece8);
        *local_ae8 = rVar7 * 100.0 + -50.0;
        if ((local_5d & 1) == 0) {
          if (((local_5f & 1) != 0) || ((local_5e & 1) != 0)) {
            *local_ae8 = *local_ae8 / 10.0;
          }
        }
        else {
          dVar8 = exp(*local_ae8);
          *local_ae8 = dVar8;
        }
      }
    }
    poVar4 = std::operator<<((ostream *)&std::cerr,"Running");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    if ((local_49 & 1) == 0) {
      if ((local_5d & 1) == 0) {
        if ((local_5e & 1) == 0) {
          if ((local_5f & 1) == 0) {
            this = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this,"!(isExp || isLog || isSigm || isTanh)");
            __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,in_stack_ffffffffffffed20);
          BenchmarkFunc<TSlowTanh,double>
                    (in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8,
                     (size_t)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8,
                     in_stack_ffffffffffffeda0);
          std::__cxx11::string::~string(local_ea0);
          std::allocator<char>::~allocator(&local_ea1);
          auVar12._8_4_ = (int)((ulong)local_38 >> 0x20);
          auVar12._0_8_ = local_38;
          auVar12._12_4_ = 0x45300000;
          round(((auVar12._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_38) - 4503599627370496.0)) * 0.5);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,in_stack_ffffffffffffed20);
          BenchmarkFunc<TPlainTanh,double>
                    (in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8,
                     (size_t)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8,
                     in_stack_ffffffffffffeda0);
          std::__cxx11::string::~string(local_ec8);
          std::allocator<char>::~allocator(&local_ec9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,in_stack_ffffffffffffed20);
          BenchmarkFunc<TAvxTanh<false>,double>
                    (in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8,
                     (size_t)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8,
                     in_stack_ffffffffffffeda0);
          std::__cxx11::string::~string(local_ef0);
          std::allocator<char>::~allocator(&local_ef1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,in_stack_ffffffffffffed20);
          BenchmarkFunc<TAvxTanh<true>,double>
                    (in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8,
                     (size_t)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8,
                     in_stack_ffffffffffffeda0);
          std::__cxx11::string::~string(local_f18);
          std::allocator<char>::~allocator(&local_f19);
          pcVar14 = local_40;
          pbVar15 = local_38;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (pbVar15,pcVar14,in_stack_ffffffffffffed20);
          BenchmarkFunc<TDispatchedAvx2Tanh<false>,double>
                    (in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8,
                     (size_t)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8,
                     in_stack_ffffffffffffeda0);
          std::__cxx11::string::~string(local_f40);
          std::allocator<char>::~allocator(&local_f41);
          bVar3 = NFastOps::HaveAvx2();
          if (bVar3) {
            paVar13 = &local_f69;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>(pbVar15,pcVar14,paVar13);
            BenchmarkFunc<TAvx2Tanh<false>,double>
                      (in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8,
                       (size_t)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8,
                       in_stack_ffffffffffffeda0);
            std::__cxx11::string::~string(local_f68);
            std::allocator<char>::~allocator(&local_f69);
            in_stack_ffffffffffffed00 = local_38;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>(pbVar15,pcVar14,paVar13);
            BenchmarkFunc<TAvx2Tanh<true>,double>
                      (in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8,
                       (size_t)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8,
                       in_stack_ffffffffffffeda0);
            std::__cxx11::string::~string(local_f90);
            std::allocator<char>::~allocator(&local_f91);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,in_stack_ffffffffffffed20);
          BenchmarkFunc<TSlowSigm,double>
                    (in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8,
                     (size_t)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8,
                     in_stack_ffffffffffffeda0);
          std::__cxx11::string::~string(local_d88);
          std::allocator<char>::~allocator(&local_d89);
          auVar11._8_4_ = (int)((ulong)local_38 >> 0x20);
          auVar11._0_8_ = local_38;
          auVar11._12_4_ = 0x45300000;
          round(((auVar11._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_38) - 4503599627370496.0)) * 0.5);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,in_stack_ffffffffffffed20);
          BenchmarkFunc<TPlainSigm,double>
                    (in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8,
                     (size_t)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8,
                     in_stack_ffffffffffffeda0);
          std::__cxx11::string::~string(local_db0);
          std::allocator<char>::~allocator(&local_db1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,in_stack_ffffffffffffed20);
          BenchmarkFunc<TAvxSigm<false>,double>
                    (in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8,
                     (size_t)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8,
                     in_stack_ffffffffffffeda0);
          std::__cxx11::string::~string(local_dd8);
          std::allocator<char>::~allocator(&local_dd9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,in_stack_ffffffffffffed20);
          BenchmarkFunc<TAvxSigm<true>,double>
                    (in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8,
                     (size_t)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8,
                     in_stack_ffffffffffffeda0);
          std::__cxx11::string::~string(local_e00);
          std::allocator<char>::~allocator(&local_e01);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,in_stack_ffffffffffffed20);
          BenchmarkFunc<TDispatchedAvx2Sigm<false>,double>
                    (in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8,
                     (size_t)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8,
                     in_stack_ffffffffffffeda0);
          std::__cxx11::string::~string(local_e28);
          std::allocator<char>::~allocator(&local_e29);
          bVar3 = NFastOps::HaveAvx2();
          if (bVar3) {
            inVectors_00 = (vector<double_*,_std::allocator<double_*>_> *)local_e51;
            pcVar14 = local_40;
            outVectors_00 = local_38;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,in_stack_ffffffffffffed20
                      );
            BenchmarkFunc<TAvx2Sigm<false>,double>
                      (inVectors_00,(vector<double_*,_std::allocator<double_*>_> *)outVectors_00,
                       (size_t)pcVar14,in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0);
            std::__cxx11::string::~string((string *)(local_e51 + 1));
            std::allocator<char>::~allocator((allocator<char> *)local_e51);
            paVar13 = &local_e79;
            pbVar15 = local_38;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,in_stack_ffffffffffffed20
                      );
            BenchmarkFunc<TAvx2Sigm<true>,double>
                      (inVectors_00,(vector<double_*,_std::allocator<double_*>_> *)outVectors_00,
                       (size_t)pcVar14,(size_t)paVar13,pbVar15);
            std::__cxx11::string::~string(local_e78);
            std::allocator<char>::~allocator(&local_e79);
          }
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,in_stack_ffffffffffffed20);
        BenchmarkFunc<TSlowLog,double>
                  (in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8,
                   (size_t)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8,
                   in_stack_ffffffffffffeda0);
        std::__cxx11::string::~string(local_c48);
        std::allocator<char>::~allocator(&local_c49);
        auVar10._8_4_ = (int)((ulong)local_38 >> 0x20);
        auVar10._0_8_ = local_38;
        auVar10._12_4_ = 0x45300000;
        round(((auVar10._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)local_38) - 4503599627370496.0)) * 0.5);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,in_stack_ffffffffffffed20);
        BenchmarkFunc<TPlainLog,double>
                  (in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8,
                   (size_t)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8,
                   in_stack_ffffffffffffeda0);
        std::__cxx11::string::~string(local_c70);
        std::allocator<char>::~allocator(&local_c71);
        if (((ulong)local_40 & 3) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,in_stack_ffffffffffffed20);
          BenchmarkFunc<TFmathLog,double>
                    (in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8,
                     (size_t)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8,
                     in_stack_ffffffffffffeda0);
          std::__cxx11::string::~string(local_c98);
          std::allocator<char>::~allocator(&local_c99);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,in_stack_ffffffffffffed20);
        BenchmarkFunc<TAvxLog<false>,double>
                  (in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8,
                   (size_t)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8,
                   in_stack_ffffffffffffeda0);
        std::__cxx11::string::~string(local_cc0);
        std::allocator<char>::~allocator(&local_cc1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,in_stack_ffffffffffffed20);
        BenchmarkFunc<TDispatchedAvx2Log<false>,double>
                  (in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8,
                   (size_t)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8,
                   in_stack_ffffffffffffeda0);
        std::__cxx11::string::~string(local_ce8);
        std::allocator<char>::~allocator(&local_ce9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,in_stack_ffffffffffffed20);
        BenchmarkFunc<TAvxLog<true>,double>
                  (in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8,
                   (size_t)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8,
                   in_stack_ffffffffffffeda0);
        std::__cxx11::string::~string(local_d10);
        std::allocator<char>::~allocator(&local_d11);
        bVar3 = NFastOps::HaveAvx2();
        if (bVar3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,in_stack_ffffffffffffed20);
          BenchmarkFunc<TAvx2Log<false>,double>
                    (in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8,
                     (size_t)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8,
                     in_stack_ffffffffffffeda0);
          std::__cxx11::string::~string(local_d38);
          std::allocator<char>::~allocator(&local_d39);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,in_stack_ffffffffffffed20);
          BenchmarkFunc<TAvx2Log<true>,double>
                    (in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8,
                     (size_t)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8,
                     in_stack_ffffffffffffeda0);
          std::__cxx11::string::~string(local_d60);
          std::allocator<char>::~allocator(&local_d61);
        }
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,in_stack_ffffffffffffed20);
      BenchmarkFunc<TSlowExp,double>
                (in_stack_ffffffffffffedd0,in_stack_ffffffffffffedc8,
                 (size_t)in_stack_ffffffffffffedc0,(size_t)in_stack_ffffffffffffedb8,
                 in_stack_ffffffffffffedb0);
      std::__cxx11::string::~string(local_b08);
      std::allocator<char>::~allocator(&local_b09);
      auVar9._8_4_ = (int)((ulong)local_38 >> 0x20);
      auVar9._0_8_ = local_38;
      auVar9._12_4_ = 0x45300000;
      round(((auVar9._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)local_38) - 4503599627370496.0)) * 0.5);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,in_stack_ffffffffffffed20);
      BenchmarkFunc<TPlainExp,double>
                (in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8,
                 (size_t)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8,
                 in_stack_ffffffffffffeda0);
      std::__cxx11::string::~string(local_b30);
      std::allocator<char>::~allocator(&local_b31);
      if ((((ulong)local_40 & 3) == 0) && ((local_48 == 0 || (local_48 == 0x10)))) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,in_stack_ffffffffffffed20);
        BenchmarkFunc<TFmathExp,double>
                  (in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8,
                   (size_t)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8,
                   in_stack_ffffffffffffeda0);
        std::__cxx11::string::~string(local_b58);
        std::allocator<char>::~allocator(&local_b59);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,in_stack_ffffffffffffed20);
      BenchmarkFunc<TAvxExp<false>,double>
                (in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8,
                 (size_t)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8,
                 in_stack_ffffffffffffeda0);
      std::__cxx11::string::~string(local_b80);
      std::allocator<char>::~allocator(&local_b81);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,in_stack_ffffffffffffed20);
      BenchmarkFunc<TAvxExp<true>,double>
                (in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8,
                 (size_t)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8,
                 in_stack_ffffffffffffeda0);
      std::__cxx11::string::~string(local_ba8);
      std::allocator<char>::~allocator(&local_ba9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,in_stack_ffffffffffffed20);
      BenchmarkFunc<TDispatchedAvx2Exp<false>,double>
                (in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8,
                 (size_t)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8,
                 in_stack_ffffffffffffeda0);
      std::__cxx11::string::~string(local_bd0);
      std::allocator<char>::~allocator(&local_bd1);
      bVar3 = NFastOps::HaveAvx2();
      if (bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,in_stack_ffffffffffffed20);
        BenchmarkFunc<TAvx2Exp<false>,double>
                  (in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8,
                   (size_t)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8,
                   in_stack_ffffffffffffeda0);
        std::__cxx11::string::~string(local_bf8);
        std::allocator<char>::~allocator(&local_bf9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffed30,in_stack_ffffffffffffed28,in_stack_ffffffffffffed20);
        BenchmarkFunc<TAvx2Exp<true>,double>
                  (in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8,
                   (size_t)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8,
                   in_stack_ffffffffffffeda0);
        std::__cxx11::string::~string(local_c20);
        std::allocator<char>::~allocator(&local_c21);
      }
    }
    std::vector<double_*,_std::allocator<double_*>_>::~vector
              ((vector<double_*,_std::allocator<double_*>_> *)in_stack_ffffffffffffed00);
    std::vector<double_*,_std::allocator<double_*>_>::~vector
              ((vector<double_*,_std::allocator<double_*>_> *)in_stack_ffffffffffffed00);
    std::
    vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ::~vector((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffed00);
    std::
    vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ::~vector((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffed00);
    std::__cxx11::string::~string(local_28);
    return;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,
                           "requirement on natural alignment failed: alignment should be multiple of "
                          );
  pvVar5 = (void *)std::ostream::operator<<(poVar4,8);
  std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

void RunBenchmark(const TBenchmarkOpts& opts) {
    std::string func = opts.Func;
    size_t nVectors = opts.NVectors;
    size_t nIter = opts.NIter;
    size_t vecSize = opts.VecSize;
    size_t alignment = opts.Alignment;

    bool isExp = func == "exp";
    bool isLog = func == "log";
    bool isSigm = func == "sigm";
    bool isTanh = func == "tanh";
    if (!(isExp || isLog || isSigm || isTanh)) {
        std::cerr << "requirement isExp || isLog || isSigm || isTanh failed" << std::endl;
        exit(1);
    }

    std::cerr << "Preparing data. Vector size: " << vecSize << "\tnumber of vectors: " << nVectors << "\tnumber of tries: " << nIter << std::endl;
    std::mt19937_64 rng(15);
    std::uniform_real_distribution<> dis(0, 1.0);
    std::vector<std::vector<char>> inData(nVectors);
    std::vector<std::vector<char>> outData(nVectors);

    if (alignment >= 32) {
        std::cerr << "requirement alignment < 32 failed" << std::endl;
        exit(1);
    }
    if (alignment % sizeof(T) != 0) {
        std::cerr << "requirement on natural alignment failed: alignment should be multiple of " << sizeof(T) << std::endl;
        exit(1);
    }

    std::vector<T*> inVectors(nVectors);
    std::vector<T*> outVectors(nVectors);
    for (size_t i = 0; i < nVectors; ++i) {
        inData[i].resize(vecSize * sizeof(T) + 32);
        outData[i].resize(vecSize * sizeof(T) + 32);
        char* inV = inData[i].data();
        size_t cnt = 0;
        while ((size_t)inV % 32 != alignment) {
            ++inV;
        }
        cnt = 0;
        char* outV = outData[i].data();
        while ((size_t)outV % 32 != alignment) {
            ++outV;
        }

        inVectors[i] = (T*)inV;
        outVectors[i] = (T*)outV;
        for (size_t j = 0; j < vecSize; ++j) {
            auto& val = ((T*)inV)[j];
            val = 100 * dis(rng) - 50;
            if (isLog) {
                val = exp(val);
            } else if (isTanh || isSigm) {
                val /= 10;
            }
        }
    }

    std::cerr << "Running" << std::endl;
    if (isExp) {
        // too slow, just one iteration
        BenchmarkFunc<TSlowExp>(inVectors, outVectors, vecSize, 1, "slow exp");

        // slow, half iterations
        BenchmarkFunc<TPlainExp>(inVectors, outVectors, vecSize, int(round(nIter / 2.0)), "plain fast exp");

        if (vecSize % 4 == 0 && (alignment == 0 || alignment == 16)) {
            BenchmarkFunc<TFmathExp>(inVectors, outVectors, vecSize, nIter, "fmath exp");
        }
        BenchmarkFunc<TAvxExp<false>>(inVectors, outVectors, vecSize, nIter, "avx fast exp");
        BenchmarkFunc<TAvxExp<true>>(inVectors, outVectors, vecSize, nIter, "avx fast exact exp");
        BenchmarkFunc<TDispatchedAvx2Exp<false>>(
            inVectors, outVectors, vecSize, nIter, "dispatched fast exp");
        if (NFastOps::HaveAvx2()) {
            BenchmarkFunc<TAvx2Exp<false>>(inVectors, outVectors, vecSize, nIter, "avx2 fast exp");
            BenchmarkFunc<TAvx2Exp<true>>(inVectors, outVectors, vecSize, nIter, "avx2 fast exact exp");
        }
    } else if (isLog) {
        // too slow, just one iteration
        BenchmarkFunc<TSlowLog>(inVectors, outVectors, vecSize, 1, "slow log");

        // slow, half iterations
        BenchmarkFunc<TPlainLog>(inVectors, outVectors, vecSize, int(round(nIter / 2.0)), "plain fast log");

        if (vecSize % 4 == 0) {
            BenchmarkFunc<TFmathLog>(inVectors, outVectors, vecSize, nIter, "fmath log");
        }
        BenchmarkFunc<TAvxLog<false>>(inVectors, outVectors, vecSize, nIter, "avx fast log");
        BenchmarkFunc<TDispatchedAvx2Log<false>>(
            inVectors, outVectors, vecSize, nIter, "dispatched fast log");
        BenchmarkFunc<TAvxLog<true>>(inVectors, outVectors, vecSize, nIter, "avx fast exact log");
        if (NFastOps::HaveAvx2()) {
            BenchmarkFunc<TAvx2Log<false>>(inVectors, outVectors, vecSize, nIter, "avx2 fast log");
            BenchmarkFunc<TAvx2Log<true>>(inVectors, outVectors, vecSize, nIter, "avx2 fast exact log");
        }
    } else if (isSigm) {
        // too slow, just one iteration
        BenchmarkFunc<TSlowSigm>(inVectors, outVectors, vecSize, 1, "slow sigmoid");

        // slow, half iterations
        BenchmarkFunc<TPlainSigm>(inVectors, outVectors, vecSize, int(round(nIter / 2.0)), "plain fast sigmoid");

        BenchmarkFunc<TAvxSigm<false>>(inVectors, outVectors, vecSize, nIter, "avx fast sigmoid");
        BenchmarkFunc<TAvxSigm<true>>(inVectors, outVectors, vecSize, nIter, "avx fast exact sigmoid");
        BenchmarkFunc<TDispatchedAvx2Sigm<false>>(
            inVectors, outVectors, vecSize, nIter, "dispatched fast sigmoid");
        if (NFastOps::HaveAvx2()) {
            BenchmarkFunc<TAvx2Sigm<false>>(inVectors, outVectors, vecSize, nIter, "avx2 fast sigmoid");
            BenchmarkFunc<TAvx2Sigm<true>>(inVectors, outVectors, vecSize, nIter, "avx2 fast exact sigmoid");
        }
    } else if (isTanh) {
        // too slow, just one iteration
        BenchmarkFunc<TSlowTanh>(inVectors, outVectors, vecSize, 1, "slow tanh");

        // slow, half iterations
        BenchmarkFunc<TPlainTanh>(inVectors, outVectors, vecSize, int(round(nIter / 2.0)), "plain fast tanh");

        BenchmarkFunc<TAvxTanh<false>>(inVectors, outVectors, vecSize, nIter, "avx fast tanh");
        BenchmarkFunc<TAvxTanh<true>>(inVectors, outVectors, vecSize, nIter, "avx fast exact tanh");
        BenchmarkFunc<TDispatchedAvx2Tanh<false>>(
            inVectors, outVectors, vecSize, nIter, "dispatched fast sigmoid");
        if (NFastOps::HaveAvx2()) {
            BenchmarkFunc<TAvx2Tanh<false>>(inVectors, outVectors, vecSize, nIter, "avx2 fast tanh");
            BenchmarkFunc<TAvx2Tanh<true>>(inVectors, outVectors, vecSize, nIter, "avx2 fast exact tanh");
        }
    } else {
        throw std::runtime_error("!(isExp || isLog || isSigm || isTanh)");
    }
}